

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O1

string * sha256(string *__return_storage_ptr__,string *input)

{
  size_t sVar1;
  int i;
  long lVar2;
  byte *__s;
  uchar digest [32];
  char buf [65];
  SHA256 ctx;
  byte local_138 [96];
  undefined1 local_d8;
  SHA256 local_c8;
  
  local_138[0x10] = 0;
  local_138[0x11] = 0;
  local_138[0x12] = 0;
  local_138[0x13] = 0;
  local_138[0x14] = 0;
  local_138[0x15] = 0;
  local_138[0x16] = 0;
  local_138[0x17] = 0;
  local_138[0x18] = 0;
  local_138[0x19] = 0;
  local_138[0x1a] = 0;
  local_138[0x1b] = 0;
  local_138[0x1c] = 0;
  local_138[0x1d] = 0;
  local_138[0x1e] = 0;
  local_138[0x1f] = 0;
  local_138[0] = 0;
  local_138[1] = 0;
  local_138[2] = 0;
  local_138[3] = 0;
  local_138[4] = 0;
  local_138[5] = 0;
  local_138[6] = 0;
  local_138[7] = 0;
  local_138[8] = 0;
  local_138[9] = 0;
  local_138[10] = 0;
  local_138[0xb] = 0;
  local_138[0xc] = 0;
  local_138[0xd] = 0;
  local_138[0xe] = 0;
  local_138[0xf] = 0;
  memset(&local_c8,0,0xa8);
  local_c8.m_h[0] = 0x6a09e667;
  local_c8.m_h[1] = 0xbb67ae85;
  local_c8.m_h[2] = 0x3c6ef372;
  local_c8.m_h[3] = 0xa54ff53a;
  local_c8.m_h[4] = 0x510e527f;
  local_c8.m_h[5] = 0x9b05688c;
  local_c8.m_h[6] = 0x1f83d9ab;
  local_c8.m_h[7] = 0x5be0cd19;
  local_c8.m_tot_len = 0;
  local_c8.m_len = 0;
  SHA256::update(&local_c8,(uchar *)(input->_M_dataplus)._M_p,(uint)input->_M_string_length);
  SHA256::final(&local_c8,local_138);
  __s = local_138 + 0x20;
  local_d8 = 0;
  lVar2 = 0;
  do {
    sprintf((char *)__s,"%02x",(ulong)local_138[lVar2]);
    lVar2 = lVar2 + 1;
    __s = __s + 2;
  } while (lVar2 != 0x20);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen((char *)(local_138 + 0x20));
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_138 + 0x20,local_138 + sVar1 + 0x20);
  return __return_storage_ptr__;
}

Assistant:

std::string sha256(std::string input)
{
    unsigned char digest[SHA256::DIGEST_SIZE];
    memset(digest,0,SHA256::DIGEST_SIZE);
 
    SHA256 ctx = SHA256();
    ctx.init();
    ctx.update( (unsigned char*)input.c_str(), input.length());
    ctx.final(digest);
 
    char buf[2*SHA256::DIGEST_SIZE+1];
    buf[2*SHA256::DIGEST_SIZE] = 0;
    for (int i = 0; i < SHA256::DIGEST_SIZE; i++)
        sprintf(buf+i*2, "%02x", digest[i]);
    return std::string(buf);
}